

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void handleSystemIncludesDep
               (cmMakefile *mf,cmTarget *depTgt,string *config,cmTarget *headTarget,
               cmGeneratorExpressionDAGChecker *dagChecker,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *result,bool excludeImported)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  cmGeneratorExpressionDAGChecker *pcVar2;
  cmTarget *pcVar3;
  string *psVar4;
  cmTarget *pcVar5;
  bool bVar6;
  char *pcVar7;
  cmCompiledGeneratorExpression *pcVar8;
  allocator local_159;
  string local_158;
  cmGeneratorExpression local_138;
  string local_130;
  cmGeneratorExpression local_110;
  cmGeneratorExpression ge_1;
  string local_100;
  char *local_e0;
  char *dirs_1;
  string local_d0;
  cmGeneratorExpression local_b0;
  string local_a8;
  cmGeneratorExpression local_88;
  cmGeneratorExpression ge;
  allocator local_69;
  string local_68;
  char *local_48;
  char *dirs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_38;
  bool excludeImported_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result_local;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  cmTarget *headTarget_local;
  string *config_local;
  cmTarget *depTgt_local;
  cmMakefile *mf_local;
  
  dirs._7_1_ = excludeImported;
  pvStack_38 = result;
  result_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)dagChecker;
  dagChecker_local = (cmGeneratorExpressionDAGChecker *)headTarget;
  headTarget_local = (cmTarget *)config;
  config_local = (string *)depTgt;
  depTgt_local = (cmTarget *)mf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",&local_69)
  ;
  pcVar7 = cmTarget::GetProperty(depTgt,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_48 = pcVar7;
  if (pcVar7 != (char *)0x0) {
    cmGeneratorExpression::cmGeneratorExpression(&local_88,(cmListFileBacktrace *)0x0);
    cmGeneratorExpression::Parse(&local_b0,(char *)&local_88);
    pcVar8 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->
                       ((auto_ptr<cmCompiledGeneratorExpression> *)&local_b0);
    pcVar5 = depTgt_local;
    psVar4 = config_local;
    pcVar3 = headTarget_local;
    pcVar2 = dagChecker_local;
    pvVar1 = result_local;
    std::__cxx11::string::string((string *)&local_d0);
    pcVar7 = cmCompiledGeneratorExpression::Evaluate
                       (pcVar8,(cmMakefile *)pcVar5,(string *)pcVar3,false,(cmTarget *)pcVar2,
                        (cmTarget *)psVar4,(cmGeneratorExpressionDAGChecker *)pvVar1,&local_d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a8,pcVar7,(allocator *)((long)&dirs_1 + 7));
    cmSystemTools::ExpandListArgument(&local_a8,pvStack_38,false);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&dirs_1 + 7));
    std::__cxx11::string::~string((string *)&local_d0);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&local_b0);
    cmGeneratorExpression::~cmGeneratorExpression(&local_88);
  }
  bVar6 = cmTarget::IsImported((cmTarget *)config_local);
  psVar4 = config_local;
  if ((bVar6) && ((dirs._7_1_ & 1) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_100,"INTERFACE_INCLUDE_DIRECTORIES",
               (allocator *)((long)&ge_1.Backtrace + 7));
    pcVar7 = cmTarget::GetProperty((cmTarget *)psVar4,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)((long)&ge_1.Backtrace + 7));
    if (pcVar7 != (char *)0x0) {
      local_e0 = pcVar7;
      cmGeneratorExpression::cmGeneratorExpression(&local_110,(cmListFileBacktrace *)0x0);
      cmGeneratorExpression::Parse(&local_138,(char *)&local_110);
      pcVar8 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->
                         ((auto_ptr<cmCompiledGeneratorExpression> *)&local_138);
      pcVar5 = depTgt_local;
      psVar4 = config_local;
      pcVar3 = headTarget_local;
      pcVar2 = dagChecker_local;
      pvVar1 = result_local;
      std::__cxx11::string::string((string *)&local_158);
      pcVar7 = cmCompiledGeneratorExpression::Evaluate
                         (pcVar8,(cmMakefile *)pcVar5,(string *)pcVar3,false,(cmTarget *)pcVar2,
                          (cmTarget *)psVar4,(cmGeneratorExpressionDAGChecker *)pvVar1,&local_158);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_130,pcVar7,&local_159);
      cmSystemTools::ExpandListArgument(&local_130,pvStack_38,false);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator((allocator<char> *)&local_159);
      std::__cxx11::string::~string((string *)&local_158);
      cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                ((auto_ptr<cmCompiledGeneratorExpression> *)&local_138);
      cmGeneratorExpression::~cmGeneratorExpression(&local_110);
    }
  }
  return;
}

Assistant:

static void handleSystemIncludesDep(cmMakefile *mf, cmTarget const* depTgt,
                                  const std::string& config,
                                  cmTarget *headTarget,
                                  cmGeneratorExpressionDAGChecker *dagChecker,
                                  std::vector<std::string>& result,
                                  bool excludeImported)
{
  if (const char* dirs =
          depTgt->GetProperty("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES"))
    {
    cmGeneratorExpression ge;
    cmSystemTools::ExpandListArgument(ge.Parse(dirs)
                                      ->Evaluate(mf,
                                      config, false, headTarget,
                                      depTgt, dagChecker), result);
    }
  if (!depTgt->IsImported() || excludeImported)
    {
    return;
    }

  if (const char* dirs =
                depTgt->GetProperty("INTERFACE_INCLUDE_DIRECTORIES"))
    {
    cmGeneratorExpression ge;
    cmSystemTools::ExpandListArgument(ge.Parse(dirs)
                                      ->Evaluate(mf,
                                      config, false, headTarget,
                                      depTgt, dagChecker), result);
    }
}